

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

ImPlotTime ImPlot::CombineDateTime(ImPlotTime *date_part,ImPlotTime *tod_part)

{
  tm *__tp;
  int iVar1;
  int iVar2;
  int iVar3;
  ImPlotContext *pIVar4;
  long lVar5;
  long lVar6;
  ImPlotTime IVar7;
  
  pIVar4 = GImPlot;
  __tp = &GImPlot->Tm;
  if ((GImPlot->Style).UseLocalTime == true) {
    localtime_r(&date_part->S,(tm *)__tp);
  }
  else {
    gmtime_r(&date_part->S,(tm *)__tp);
  }
  iVar1 = (pIVar4->Tm).tm_year;
  iVar2 = (pIVar4->Tm).tm_mday;
  iVar3 = (pIVar4->Tm).tm_mon;
  if ((GImPlot->Style).UseLocalTime == true) {
    localtime_r(&tod_part->S,(tm *)&GImPlot->Tm);
  }
  else {
    gmtime_r(&tod_part->S,(tm *)&GImPlot->Tm);
  }
  (pIVar4->Tm).tm_year = iVar1;
  (pIVar4->Tm).tm_mon = iVar3;
  (pIVar4->Tm).tm_mday = iVar2;
  if ((GImPlot->Style).UseLocalTime == true) {
    lVar5 = mktime((tm *)__tp);
  }
  else {
    lVar5 = timegm((tm *)__tp);
  }
  lVar6 = 0;
  if (0 < lVar5) {
    lVar6 = lVar5;
  }
  IVar7.Us = tod_part->Us;
  IVar7.S = lVar6;
  IVar7._12_4_ = 0;
  return IVar7;
}

Assistant:

ImPlotTime CombineDateTime(const ImPlotTime& date_part, const ImPlotTime& tod_part) {
    tm& Tm = GImPlot->Tm;
    GetTime(date_part, &GImPlot->Tm);
    int y = Tm.tm_year;
    int m = Tm.tm_mon;
    int d = Tm.tm_mday;
    GetTime(tod_part, &GImPlot->Tm);
    Tm.tm_year = y;
    Tm.tm_mon  = m;
    Tm.tm_mday = d;
    ImPlotTime t = MkTime(&Tm);
    t.Us = tod_part.Us;
    return t;
}